

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cout.c
# Opt level: O0

char * cout_openTag(FILE *out,char *line)

{
  int iVar1;
  csafestring_t *str;
  csafestring_t *size;
  char *pcVar2;
  csafestring_t *in_RSI;
  FILE *in_RDI;
  csafestring_t *defaultValue;
  csafestring_t *value;
  char *local_38;
  char *in_stack_fffffffffffffff8;
  
  str = modules_extractVariable(in_stack_fffffffffffffff8,(char *)in_RDI);
  size = modules_extractVariable(in_stack_fffffffffffffff8,(char *)in_RDI);
  if (str == (csafestring_t *)0x0) {
    safe_destroy((csafestring_t *)0x10638c);
    safe_destroy((csafestring_t *)0x106396);
    pcVar2 = modules_findEndOfTag((char *)0x1063a0);
  }
  else {
    iVar1 = safe_strncmp(in_RSI,(char *)str,(size_t)size);
    if (iVar1 == 0) {
      fprintf(in_RDI,"__internal_tmp = ");
      expression_eval((FILE *)in_RDI,(char *)in_RSI,SUB81((ulong)str >> 0x38,0));
      fprintf(in_RDI,";\n");
      if (size == (csafestring_t *)0x0) {
        local_38 = "";
      }
      else {
        local_38 = size->data;
      }
      fprintf(in_RDI,
              "__internal_hfunction->safe_strcat(__internal_string, (__internal_tmp != NULL) ? __internal_tmp : \"%s\");\n"
              ,local_38);
    }
    else {
      fprintf(in_RDI,"__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n",str->data);
    }
    safe_destroy((csafestring_t *)0x106475);
    safe_destroy((csafestring_t *)0x10647f);
    pcVar2 = modules_findEndOfTag((char *)0x106489);
  }
  return pcVar2 + 1;
}

Assistant:

static char *cout_openTag(FILE *out, char *line) {
	csafestring_t *value = modules_extractVariable(line, "value");
	csafestring_t *defaultValue = modules_extractVariable(line, "default");

	if ( value == NULL ) {
		safe_destroy(value);
		safe_destroy(defaultValue);
		return modules_findEndOfTag(line) + 1;
	}

	if ( !safe_strncmp(value, "${", 2) ) {
		fprintf(out, "__internal_tmp = ");
		expression_eval(out, value->data, true);
		fprintf(out, ";\n");
		fprintf(out, "__internal_hfunction->safe_strcat(__internal_string, (__internal_tmp != NULL) ? __internal_tmp : \"%s\");\n", ( defaultValue != NULL ) ? defaultValue->data : "");
	} else {
		fprintf(out, "__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n", value->data);
	}

	safe_destroy(value);
	safe_destroy(defaultValue);
	return modules_findEndOfTag(line) + 1;
}